

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O2

_Bool effect_handler_CHAIN(effect_handler_context_t *context)

{
  loc_conflict *plVar1;
  wchar_t wVar2;
  loc grid;
  _Bool _Var3;
  wchar_t dam;
  uint32_t uVar4;
  uint32_t uVar5;
  int iVar6;
  wchar_t wVar7;
  monster *pmVar8;
  monster *pmVar9;
  wchar_t wVar10;
  loc grid_00;
  loc grid1;
  wchar_t wVar11;
  long lVar12;
  wchar_t wVar13;
  source sVar14;
  anon_enum_32 local_390;
  uint32_t local_38c;
  anon_union_8_5_62f3dbed_for_which local_388;
  monster *avail_mon [100];
  
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  uVar4 = Rand_div(10);
  wVar2 = (player->grid).x;
  wVar13 = (player->grid).y;
  sVar14 = source_player();
  local_388 = sVar14.which;
  local_390 = sVar14.what;
  for (lVar12 = 0; lVar12 != 100; lVar12 = lVar12 + 1) {
    avail_mon[lVar12] = (monster *)0x0;
  }
  uVar5 = 0xfffffffd;
  if (-3 < (int)uVar4) {
    uVar5 = uVar4;
  }
  iVar6 = 0;
  while( true ) {
    if (iVar6 == uVar5 + 3) {
      return true;
    }
    grid1.y = wVar13;
    grid1.x = wVar2;
    local_38c = 0;
    for (wVar10 = wVar13 + L'\xfffffffb'; wVar11 = wVar2 + L'\xfffffffb', wVar10 <= wVar13 + L'\x05'
        ; wVar10 = wVar10 + L'\x01') {
      for (; wVar11 <= wVar2 + L'\x05'; wVar11 = wVar11 + L'\x01') {
        grid_00.y = wVar10;
        grid_00.x = wVar11;
        wVar7 = distance((loc_conflict)grid1,(loc_conflict)grid_00);
        if ((((wVar7 < L'\x06') && (_Var3 = square_in_bounds_fully(cave,grid_00), _Var3)) &&
            (_Var3 = projectable((chunk *)cave,grid1,grid_00,L'H'), _Var3)) &&
           (pmVar8 = square_monster(cave,grid_00), pmVar8 != (monster *)0x0)) {
          pmVar8 = square_monster(cave,grid_00);
          lVar12 = (long)(int)local_38c;
          local_38c = local_38c + 1;
          avail_mon[lVar12] = pmVar8;
        }
      }
    }
    if (local_38c == 0) break;
    uVar4 = Rand_div(local_38c);
    pmVar8 = avail_mon[(int)uVar4];
    plVar1 = &pmVar8->grid;
    wVar2 = plVar1->x;
    wVar13 = (pmVar8->grid).y;
    grid.x = plVar1->x;
    grid.y = plVar1->y;
    pmVar9 = square_monster(cave,grid);
    if (pmVar9 == (monster *)0x0) {
      return true;
    }
    sVar14._4_4_ = 0;
    sVar14.what = local_390;
    sVar14.which.trap = local_388.trap;
    project(sVar14,L'\x01',grid,dam,context->subtype,L'H',L'\0','\0',(object *)0x0);
    pmVar9 = square_monster(cave,grid);
    if (pmVar9 == pmVar8) {
      sVar14 = source_monster(pmVar8->midx);
    }
    else {
      sVar14 = source_grid(grid);
    }
    local_388 = sVar14.which;
    local_390 = sVar14.what;
    iVar6 = iVar6 + 1;
  }
  return true;
}

Assistant:

bool effect_handler_CHAIN(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, false);
	int k, strikes = 2 + randint1(10);
	struct loc grid, target, cur = player->grid;
	int pick, avail_mon_num;
	int flag = PROJECT_STOP | PROJECT_KILL;
	struct monster *avail_mon[100];
	struct source src = source_player();

	/* Initialise */
	for (k = 0; k < 100; k++) {
		avail_mon[k] = NULL;
	}
	target = cur;

	/* Start striking */
	for (k = 0; k < strikes; k++) {
		/* No targets yet */
		avail_mon_num = 0;

		/* Find something in range */
		for (grid.y = cur.y - 5; grid.y <= cur.y + 5; grid.y++) {
			for (grid.x = cur.x - 5; grid.x <= cur.x + 5; grid.x++) {
				int dist = distance(cur, grid);

				/* Skip distant grids */
				if (dist > 5) continue;

				/* Skip grids that are out of bounds */
				if (!square_in_bounds_fully(cave, grid)) continue;

				/* Skip grids that are not projectable */
				if (!projectable(cave, cur, grid, flag)) continue;

				/* Skip grids with no monster (including player) */
				if (!square_monster(cave, grid)) continue;

				/* Record the monster */
				avail_mon[avail_mon_num++] = square_monster(cave, grid);
			}
		}

		/* Maybe we're at a dead end */
		if (!avail_mon_num)	return true;

		/* Pick a target... */
		pick = randint0(avail_mon_num);
		target = avail_mon[pick]->grid;

		/* Paranoia */
		if (!square_monster(cave, target)) return true;

		/* ...and hit it */
		project(src, 1, target, dam, context->subtype, flag, 0, 0, NULL);

		/* Set next source (current monster may be dead) */
		cur = target;
		if (square_monster(cave, cur) == avail_mon[pick]) {
			src = source_monster(avail_mon[pick]->midx);
		} else {
			src = source_grid(cur);
		}
	}

	return true;
}